

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O0

void __thiscall
TransactionApi_FundRawTransaction_LimitAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_LimitAmountValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_4;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar;
  TransactionController tx_obj;
  TransactionApi api;
  Amount estimate_fee;
  Amount target_value;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  CoinSelectionOption option;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Amount fee;
  Address address3;
  Address address2;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  undefined8 in_stack_ffffffffffffca98;
  string *tx_hex;
  UtxoData *in_stack_ffffffffffffcaa0;
  UtxoData *this_00;
  AddressFactory *in_stack_ffffffffffffcaa8;
  TransactionContext *this_01;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  char *pcVar5;
  allocator_type *in_stack_ffffffffffffcac8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffcad0;
  TransactionContext *in_stack_ffffffffffffcad8;
  undefined4 in_stack_ffffffffffffcae0;
  undefined4 in_stack_ffffffffffffcae4;
  undefined7 in_stack_ffffffffffffcb10;
  undefined1 in_stack_ffffffffffffcb17;
  UtxoData *in_stack_ffffffffffffcb18;
  UtxoData *in_stack_ffffffffffffcb20;
  ScriptElement **local_3420;
  AssertHelper local_3390;
  Message local_3388;
  undefined4 local_337c;
  AssertionResult local_3378;
  int local_3364;
  AssertHelper local_3360;
  Message local_3358;
  undefined4 local_3350;
  uint32_t local_334c;
  AssertionResult local_3348;
  AssertHelper local_3338;
  Message local_3330;
  string local_3328;
  AssertionResult local_3308;
  AssertHelper local_32f8;
  Message local_32f0;
  int64_t local_32e8;
  int64_t local_32e0;
  undefined1 local_32d8;
  Amount local_32d0;
  int64_t local_32c0;
  AssertionResult local_32b8;
  AssertHelper local_32a8;
  Message local_32a0;
  ByteData local_3298;
  AssertHelper local_3280;
  Message local_3278;
  OutPoint local_3270;
  AssertHelper local_3248;
  Message local_3240;
  SigHashType local_3238;
  allocator local_3229;
  string local_3228;
  Privkey local_3208;
  allocator local_31e1;
  string local_31e0;
  Pubkey local_31c0;
  OutPoint local_31a8;
  AssertHelper local_3180;
  Message local_3178 [2];
  ByteData local_3168;
  byte local_3149;
  ConstCharPtr local_3148;
  AssertHelper local_3140;
  Message local_3138;
  OutPoint local_3130;
  AssertHelper local_3108;
  Message local_3100;
  SigHashType local_30f8;
  allocator local_30e9;
  string local_30e8;
  Privkey local_30c8;
  allocator local_30a1;
  string local_30a0;
  Pubkey local_3080;
  OutPoint local_3068;
  AssertHelper local_3040;
  Message local_3038 [2];
  ByteData local_3028;
  byte local_3009;
  ConstCharPtr local_3008;
  AssertHelper local_3000;
  Message local_2ff8;
  OutPoint local_2ff0;
  AssertHelper local_2fc8;
  Message local_2fc0;
  SigHashType local_2fb8;
  allocator local_2fa9;
  string local_2fa8;
  Privkey local_2f88;
  allocator in_stack_ffffffffffffd09f;
  SigHashType *in_stack_ffffffffffffd0a0;
  Privkey *in_stack_ffffffffffffd0a8;
  undefined8 in_stack_ffffffffffffd0b0;
  undefined8 in_stack_ffffffffffffd0b8;
  TransactionContext *in_stack_ffffffffffffd0c0;
  ByteData256 *in_stack_ffffffffffffd0d0;
  ByteData *in_stack_ffffffffffffd0d8;
  ByteData local_2f00;
  AssertHelper local_2ee8;
  Message local_2ee0 [2];
  string local_2ed0 [64];
  TransactionContext *in_stack_ffffffffffffd170;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd178;
  TransactionContext *in_stack_ffffffffffffd180;
  AssertHelper local_2df8;
  Message local_2df0;
  undefined4 local_2de4;
  int64_t local_2de0;
  AssertionResult local_2dd8;
  string local_2dc8;
  string local_2da8 [3];
  TransactionApi local_2d31;
  Amount local_2d30;
  Amount local_2d20 [2];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2cf8 [4];
  pointer local_2c90;
  ScriptElement *local_2c80;
  ScriptElement local_2c78 [8];
  OutPoint *in_stack_ffffffffffffd6d8;
  TransactionContext *in_stack_ffffffffffffd6e0;
  double in_stack_ffffffffffffd790;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd798;
  Amount *in_stack_ffffffffffffd7a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd7a8;
  string *in_stack_ffffffffffffd7b0;
  TransactionApi *in_stack_ffffffffffffd7b8;
  string *in_stack_ffffffffffffd7d0;
  Amount *in_stack_ffffffffffffd7d8;
  pointer in_stack_ffffffffffffd7e0;
  CoinSelectionOption *in_stack_ffffffffffffd7e8;
  pointer in_stack_ffffffffffffd7f0;
  NetType_conflict in_stack_ffffffffffffd7f8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffd800;
  Amount *in_stack_ffffffffffffd808;
  ScriptElement local_2750 [13];
  ScriptElement local_2228 [13];
  ScriptElement *local_1d00;
  undefined8 local_1cf8;
  int64_t local_1cd8;
  undefined1 local_1cd0;
  int64_t local_1cc8;
  undefined1 local_1cc0;
  Amount local_1cb8;
  int64_t local_1ca8;
  undefined1 local_1ca0;
  Transaction local_1c98 [2];
  Amount local_1be0;
  allocator local_1bc9;
  string local_1bc8;
  Address local_1ba8;
  allocator local_1a21;
  string local_1a20;
  Address local_1a00;
  allocator local_1879;
  string local_1878;
  Address local_1858;
  Amount local_16d8;
  allocator local_16c1;
  string local_16c0 [32];
  Address local_16a0;
  allocator local_1519;
  string local_1518;
  Script local_14f8;
  allocator local_14b9;
  string local_14b8;
  Txid local_1498;
  undefined8 local_1478;
  Txid local_1450;
  uint32_t local_1430;
  Script local_1428 [2];
  Address local_13b8;
  string local_1238 [32];
  Amount local_1218;
  undefined4 local_1208;
  undefined8 local_1200;
  Amount local_f50;
  allocator local_f39;
  string local_f38 [32];
  Address local_f18;
  allocator local_d91;
  string local_d90;
  Script local_d70;
  allocator local_d31;
  string local_d30;
  Txid local_d10;
  undefined8 local_cf0;
  Txid local_cc8;
  uint32_t local_ca8;
  Script local_ca0 [2];
  Address local_c30;
  string local_ab0 [32];
  int64_t local_a90;
  undefined1 local_a88;
  undefined4 local_a80;
  undefined8 local_a78;
  Amount local_7c8;
  allocator local_7b1;
  string local_7b0 [32];
  Address local_790;
  allocator local_609;
  string local_608;
  Script local_5e8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_318 [32];
  Amount local_2f8;
  undefined4 local_2e8;
  undefined8 local_2e0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffcaa0,
             (NetType)((ulong)in_stack_ffffffffffffca98 >> 0x20));
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcb17,in_stack_ffffffffffffcb10))
  ;
  local_558 = 0;
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  cfd::core::Txid::operator=(&local_530,&local_588);
  cfd::core::Txid::~Txid((Txid *)0x2f8d66);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_609);
  cfd::core::Script::Script(&local_5e8,&local_608);
  cfd::core::Script::operator=(local_508,&local_5e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",&local_7b1);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcaa8,(string *)in_stack_ffffffffffffcaa0);
  cfd::core::Address::operator=(&local_498,&local_790);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::operator=
            (local_318,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_7c8,50000000000000);
  local_2f8.ignore_check_ = local_7c8.ignore_check_;
  local_2f8.amount_ = local_7c8.amount_;
  local_2e8 = 2;
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcb17,in_stack_ffffffffffffcb10))
  ;
  local_cf0 = 0;
  local_a78 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d31);
  cfd::core::Txid::Txid(&local_d10,&local_d30);
  cfd::core::Txid::operator=(&local_cc8,&local_d10);
  cfd::core::Txid::~Txid((Txid *)0x2f8f90);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  local_ca8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d90,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d91);
  cfd::core::Script::Script(&local_d70,&local_d90);
  cfd::core::Script::operator=(local_ca0,&local_d70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",&local_f39);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcaa8,(string *)in_stack_ffffffffffffcaa0);
  cfd::core::Address::operator=(&local_c30,&local_f18);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::__cxx11::string::operator=
            (local_ab0,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_f50,2000000000000000);
  local_a88 = local_f50.ignore_check_;
  local_a90 = local_f50.amount_;
  local_a80 = 6;
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcb17,in_stack_ffffffffffffcb10))
  ;
  local_1478 = 0;
  local_1200 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14b8,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_14b9);
  cfd::core::Txid::Txid(&local_1498,&local_14b8);
  cfd::core::Txid::operator=(&local_1450,&local_1498);
  cfd::core::Txid::~Txid((Txid *)0x2f91ba);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
  local_1430 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1518,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1519);
  cfd::core::Script::Script(&local_14f8,&local_1518);
  cfd::core::Script::operator=(local_1428,&local_14f8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_16c0,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",&local_16c1);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcaa8,(string *)in_stack_ffffffffffffcaa0);
  cfd::core::Address::operator=(&local_13b8,&local_16a0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcaa0);
  std::__cxx11::string::~string(local_16c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
  std::__cxx11::string::operator=
            (local_1238,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_16d8,50000000000000);
  local_1218.ignore_check_ = local_16d8.ignore_check_;
  local_1218.amount_ = local_16d8.amount_;
  local_1208 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1878,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_1879);
  cfd::core::Address::Address(&local_1858,&local_1878);
  std::__cxx11::string::~string((string *)&local_1878);
  std::allocator<char>::~allocator((allocator<char> *)&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a20,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1a21);
  cfd::core::Address::Address(&local_1a00,&local_1a20);
  std::__cxx11::string::~string((string *)&local_1a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1bc8,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",&local_1bc9);
  cfd::core::Address::Address(&local_1ba8,&local_1bc8);
  std::__cxx11::string::~string((string *)&local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  cfd::core::Amount::Amount(&local_1be0,10000);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffcaa0,
             (uint32_t)((ulong)in_stack_ffffffffffffca98 >> 0x20),
             (uint32_t)in_stack_ffffffffffffca98);
  AVar4 = cfd::core::operator+(&local_2f8,&local_1218);
  local_1cc8 = AVar4.amount_;
  local_1cc0 = AVar4.ignore_check_;
  local_1cb8.amount_ = local_1cc8;
  local_1cb8.ignore_check_ = (bool)local_1cc0;
  AVar4 = cfd::core::operator-(&local_1cb8,&local_1be0);
  local_1cd8 = AVar4.amount_;
  local_1cd0 = AVar4.ignore_check_;
  local_1ca8 = local_1cd8;
  local_1ca0 = local_1cd0;
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)in_stack_ffffffffffffcb20,(Address *)in_stack_ffffffffffffcb18,
             (Amount *)CONCAT17(in_stack_ffffffffffffcb17,in_stack_ffffffffffffcb10));
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)in_stack_ffffffffffffcb20,(Address *)in_stack_ffffffffffffcb18,
             (Amount *)CONCAT17(in_stack_ffffffffffffcb17,in_stack_ffffffffffffcb10));
  local_2c80 = local_2c78;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18);
  local_2c80 = local_2750;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18);
  local_2c80 = local_2228;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18);
  local_1d00 = local_2c78;
  local_1cf8 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2f9635);
  __l._M_len._0_4_ = in_stack_ffffffffffffcae0;
  __l._M_array = (iterator)in_stack_ffffffffffffcad8;
  __l._M_len._4_4_ = in_stack_ffffffffffffcae4;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffcad0,__l,in_stack_ffffffffffffcac8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2f9669);
  local_3420 = &local_1d00;
  do {
    local_3420 = local_3420 + -0xa5;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcaa0);
  } while ((ScriptElement *)local_3420 != local_2c78);
  local_2c90 = (pointer)0x4034000000000000;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffcaa0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2f96ee);
  cfd::core::Amount::Amount(local_2d20);
  cfd::core::Amount::Amount(&local_2d30);
  cfd::api::TransactionApi::TransactionApi(&local_2d31);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_2da8,&local_1c98[0].super_AbstractTransaction);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_2dc8,&local_1ba8);
  this_02 = local_2cf8;
  this_00 = (UtxoData *)&local_2d30;
  tx_hex = &local_2dc8;
  pcVar5 = (char *)0x0;
  this_01 = (TransactionContext *)0x0;
  cfd::api::TransactionApi::FundRawTransaction
            (in_stack_ffffffffffffd7b8,in_stack_ffffffffffffd7b0,in_stack_ffffffffffffd7a8,
             in_stack_ffffffffffffd7a0,in_stack_ffffffffffffd798,in_stack_ffffffffffffd7d0,
             in_stack_ffffffffffffd790,in_stack_ffffffffffffd7d8,
             (UtxoFilter *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7f8,in_stack_ffffffffffffd800,
             in_stack_ffffffffffffd808);
  std::__cxx11::string::~string((string *)&local_2dc8);
  std::__cxx11::string::~string((string *)local_2da8);
  local_2de0 = cfd::core::Amount::GetSatoshiValue(&local_2d30);
  local_2de4 = 0x20a8;
  testing::internal::EqHelper<false>::Compare<long,int>
            (pcVar5,(char *)this_02,(long *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2dd8);
  if (!bVar1) {
    testing::Message::Message(&local_2df0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2f9f74);
    testing::internal::AssertHelper::AssertHelper
              (&local_2df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x163,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2df8,&local_2df0);
    testing::internal::AssertHelper::~AssertHelper(&local_2df8);
    testing::Message::~Message((Message *)0x2f9fd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2fa02f);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)tx_hex);
  cfd::TransactionContext::TransactionContext((TransactionContext *)this_00,tx_hex);
  cfd::TransactionContext::operator=
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffcae4,in_stack_ffffffffffffcae0),
             in_stack_ffffffffffffcad8);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)this_00);
  std::__cxx11::string::~string(local_2ed0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(in_stack_ffffffffffffd180,in_stack_ffffffffffffd178)
      ;
    }
  }
  else {
    testing::Message::Message(local_2ee0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x166,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2ee8,local_2ee0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ee8);
    testing::Message::~Message((Message *)0x2fa1e6);
  }
  cfd::core::ByteData::ByteData(&local_2f00);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&stack0xffffffffffffd0d8,&local_530,local_510);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffd0a0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)&stack0xffffffffffffd09f);
      cfd::core::Pubkey::Pubkey
                ((Pubkey *)&stack0xffffffffffffd0c0,(string *)&stack0xffffffffffffd0a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2fa8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_2fa9);
      cfd::core::Privkey::FromWif(&local_2f88,&local_2fa8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2fb8);
      this_00 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd0c0,(OutPoint *)in_stack_ffffffffffffd0b8,
                 (Pubkey *)in_stack_ffffffffffffd0b0,in_stack_ffffffffffffd0a8,
                 in_stack_ffffffffffffd0a0,(bool)in_stack_ffffffffffffd09f,in_stack_ffffffffffffd0d0
                 ,in_stack_ffffffffffffd0d8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2fa398);
      std::__cxx11::string::~string((string *)&local_2fa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2fa9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2fa3bf);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffd0a0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffd09f);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fa3e6);
    }
  }
  else {
    testing::Message::Message(&local_2fc0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16d,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2fc8,&local_2fc0);
    testing::internal::AssertHelper::~AssertHelper(&local_2fc8);
    testing::Message::~Message((Message *)0x2fa578);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2ff0,&local_530,local_510);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd6e0,in_stack_ffffffffffffd6d8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fa641);
    }
  }
  else {
    testing::Message::Message(&local_2ff8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3000,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16e,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3000,&local_2ff8);
    testing::internal::AssertHelper::~AssertHelper(&local_3000);
    testing::Message::~Message((Message *)0x2fa70b);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3008,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3008);
  if (bVar1) {
    local_3009 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=(&local_2f00,&local_3028);
      cfd::core::ByteData::~ByteData((ByteData *)0x2fa7f3);
    }
    if ((local_3009 & 1) == 0) {
      local_3008.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002fa8b9;
    }
  }
  else {
LAB_002fa8b9:
    testing::Message::Message(local_3038);
    testing::internal::AssertHelper::AssertHelper
              (&local_3040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16f,local_3008.value);
    testing::internal::AssertHelper::operator=(&local_3040,local_3038);
    testing::internal::AssertHelper::~AssertHelper(&local_3040);
    testing::Message::~Message((Message *)0x2fa921);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3068,&local_cc8,local_ca8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_30a0,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_30a1);
      cfd::core::Pubkey::Pubkey(&local_3080,&local_30a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_30e8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_30e9);
      cfd::core::Privkey::FromWif(&local_30c8,&local_30e8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_30f8);
      this_00 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd0c0,(OutPoint *)in_stack_ffffffffffffd0b8,
                 (Pubkey *)in_stack_ffffffffffffd0b0,in_stack_ffffffffffffd0a8,
                 in_stack_ffffffffffffd0a0,(bool)in_stack_ffffffffffffd09f,in_stack_ffffffffffffd0d0
                 ,in_stack_ffffffffffffd0d8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2faac4);
      std::__cxx11::string::~string((string *)&local_30e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_30e9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2faaeb);
      std::__cxx11::string::~string((string *)&local_30a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_30a1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fab12);
    }
  }
  else {
    testing::Message::Message(&local_3100);
    testing::internal::AssertHelper::AssertHelper
              (&local_3108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x174,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3108,&local_3100);
    testing::internal::AssertHelper::~AssertHelper(&local_3108);
    testing::Message::~Message((Message *)0x2fac8b);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3130,&local_cc8,local_ca8);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd6e0,in_stack_ffffffffffffd6d8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fad54);
    }
  }
  else {
    testing::Message::Message(&local_3138);
    testing::internal::AssertHelper::AssertHelper
              (&local_3140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x175,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3140,&local_3138);
    testing::internal::AssertHelper::~AssertHelper(&local_3140);
    testing::Message::~Message((Message *)0x2fae1e);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3148,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3148);
  if (bVar1) {
    local_3149 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=(&local_2f00,&local_3168);
      cfd::core::ByteData::~ByteData((ByteData *)0x2faf06);
    }
    if ((local_3149 & 1) != 0) goto LAB_002fb07f;
    local_3148.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3178);
  testing::internal::AssertHelper::AssertHelper
            (&local_3180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x176,local_3148.value);
  testing::internal::AssertHelper::operator=(&local_3180,local_3178);
  testing::internal::AssertHelper::~AssertHelper(&local_3180);
  testing::Message::~Message((Message *)0x2fb034);
LAB_002fb07f:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_31a8,&local_1450,local_1430);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_31e0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_31e1);
      cfd::core::Pubkey::Pubkey(&local_31c0,&local_31e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3228,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_3229);
      cfd::core::Privkey::FromWif(&local_3208,&local_3228,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_3238);
      this_00 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd0c0,(OutPoint *)in_stack_ffffffffffffd0b8,
                 (Pubkey *)in_stack_ffffffffffffd0b0,in_stack_ffffffffffffd0a8,
                 in_stack_ffffffffffffd0a0,(bool)in_stack_ffffffffffffd09f,in_stack_ffffffffffffd0d0
                 ,in_stack_ffffffffffffd0d8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2fb1d7);
      std::__cxx11::string::~string((string *)&local_3228);
      std::allocator<char>::~allocator((allocator<char> *)&local_3229);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2fb1fe);
      std::__cxx11::string::~string((string *)&local_31e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_31e1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fb225);
    }
  }
  else {
    testing::Message::Message(&local_3240);
    testing::internal::AssertHelper::AssertHelper
              (&local_3248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17b,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3248,&local_3240);
    testing::internal::AssertHelper::~AssertHelper(&local_3248);
    testing::Message::~Message((Message *)0x2fb39e);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3270,&local_1450,local_1430);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd6e0,in_stack_ffffffffffffd6d8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2fb467);
    }
  }
  else {
    testing::Message::Message(&local_3278);
    testing::internal::AssertHelper::AssertHelper
              (&local_3280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17c,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3280,&local_3278);
    testing::internal::AssertHelper::~AssertHelper(&local_3280);
    testing::Message::~Message((Message *)0x2fb531);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=(&local_2f00,&local_3298);
      cfd::core::ByteData::~ByteData((ByteData *)0x2fb5f3);
    }
  }
  else {
    testing::Message::Message(&local_32a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_32a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17e,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_32a8,&local_32a0);
    testing::internal::AssertHelper::~AssertHelper(&local_32a8);
    testing::Message::~Message((Message *)0x2fb6bd);
  }
  AVar4 = cfd::TransactionContext::GetFeeAmount(in_stack_ffffffffffffd170);
  local_32e0 = AVar4.amount_;
  local_32d8 = AVar4.ignore_check_;
  local_32d0.amount_ = local_32e0;
  local_32d0.ignore_check_ = (bool)local_32d8;
  local_32c0 = cfd::core::Amount::GetSatoshiValue(&local_32d0);
  local_32e8 = cfd::core::Amount::GetSatoshiValue(&local_2d30);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar5,(char *)this_02,(long *)this_01,(long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_32b8);
  if (!bVar1) {
    testing::Message::Message(&local_32f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2fb834);
    testing::internal::AssertHelper::AssertHelper
              (&local_32f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_32f8,&local_32f0);
    testing::internal::AssertHelper::~AssertHelper(&local_32f8);
    testing::Message::~Message((Message *)0x2fb891);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2fb8e9);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3328,&local_2f00);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3308,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,pcVar3,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  std::__cxx11::string::~string((string *)&local_3328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3308);
  if (!bVar1) {
    testing::Message::Message(&local_3330);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2fb9d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3338,&local_3330);
    testing::internal::AssertHelper::~AssertHelper(&local_3338);
    testing::Message::~Message((Message *)0x2fba2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2fba85);
  local_334c = cfd::core::Transaction::GetVsize(local_1c98);
  local_3350 = 0x19d;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar5,(char *)this_02,(uint *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3348);
  if (!bVar1) {
    testing::Message::Message(&local_3358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2fbb44);
    testing::internal::AssertHelper::AssertHelper
              (&local_3360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x181,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3360,&local_3358);
    testing::internal::AssertHelper::~AssertHelper(&local_3360);
    testing::Message::~Message((Message *)0x2fbba1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2fbbf9);
  uVar2 = cfd::core::Transaction::GetVsize(local_1c98);
  local_3364 = uVar2 * (int)(long)(double)local_2c90;
  local_337c = 0x2044;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar5,(char *)this_02,(uint *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3378);
  if (!bVar1) {
    testing::Message::Message(&local_3388);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2fbcc5);
    testing::internal::AssertHelper::AssertHelper
              (&local_3390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x184,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3390,&local_3388);
    testing::internal::AssertHelper::~AssertHelper(&local_3390);
    testing::Message::~Message((Message *)0x2fbd22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2fbd7a);
  cfd::core::ByteData::~ByteData((ByteData *)0x2fbd87);
  cfd::TransactionController::~TransactionController((TransactionController *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2fbdae);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x2fbe23);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_LimitAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{50000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}